

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringMeasure
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          StringMeasure *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Literal *other;
  shared_ptr<wasm::GCData> sVar3;
  undefined1 local_a8 [8];
  Flow flow;
  undefined1 local_48 [8];
  Literal value;
  shared_ptr<wasm::GCData> data;
  
  uVar2 = NONCONSTANT_FLOW._8_8_;
  uVar1 = NONCONSTANT_FLOW._0_8_;
  if (curr->op == StringMeasureWTF16) {
    visit((Flow *)local_a8,this,curr->ref);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      other = Flow::getSingleValue((Flow *)local_a8);
      Literal::Literal((Literal *)local_48,other);
      sVar3 = Literal::getGCData((Literal *)&value.type);
      if (value.type.id == 0) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"null ref",
                   sVar3.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
      }
      flow.breakTo.super_IString.str._M_str._0_4_ =
           (int)((*(long *)(value.type.id + 0x30) - *(long *)(value.type.id + 0x28)) / 0x18) +
           *(int *)(value.type.id + 8);
      Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
      Literal::~Literal((Literal *)local_48);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_a8);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a8);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringMeasure(StringMeasure* curr) {
    // For now we only support JS-style strings.
    if (curr->op != StringMeasureWTF16) {
      return Flow(NONCONSTANT_FLOW);
    }

    Flow flow = visit(curr->ref);
    if (flow.breaking()) {
      return flow;
    }
    auto value = flow.getSingleValue();
    auto data = value.getGCData();
    if (!data) {
      trap("null ref");
    }

    return Literal(int32_t(data->values.size()));
  }